

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

double despot::AEMS::AEMS2Likelihood(QNode *qnode)

{
  VNode *this;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this_00;
  size_type sVar1;
  QNode *this_01;
  double dVar2;
  double dVar3;
  undefined8 local_48;
  QNode *child;
  QNode *pQStack_20;
  ACT_TYPE action;
  QNode *qstar;
  VNode *vnode;
  QNode *qnode_local;
  
  this = QNode::parent(qnode);
  pQStack_20 = (QNode *)0x0;
  child._4_4_ = 0;
  do {
    this_00 = VNode::children(this);
    sVar1 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this_00);
    if (sVar1 <= (ulong)(long)child._4_4_) {
      local_48 = 1.0;
      if (pQStack_20 != qnode) {
        local_48 = 0.0;
      }
      return local_48;
    }
    this_01 = VNode::Child(this,child._4_4_);
    if (pQStack_20 == (QNode *)0x0) {
LAB_0021ad79:
      pQStack_20 = this_01;
    }
    else {
      dVar2 = QNode::upper_bound(this_01);
      dVar3 = QNode::upper_bound(pQStack_20);
      if (dVar3 < dVar2) goto LAB_0021ad79;
    }
    child._4_4_ = child._4_4_ + 1;
  } while( true );
}

Assistant:

double AEMS::AEMS2Likelihood(QNode* qnode) {
	VNode* vnode = qnode->parent();
	QNode* qstar = NULL;
	for (ACT_TYPE action = 0; action < vnode->children().size(); action++) {
		QNode* child = vnode->Child(action);

		if (qstar == NULL || child->upper_bound() > qstar->upper_bound())
			qstar = child;
	}

	return qstar == qnode;
}